

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionSkipBytes.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionSkipBytes::write_cpp
          (InstructionSkipBytes *this,StreamSepMaker *ss,StreamSepMaker *es,CppEmitter *cpp_emitter)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  StreamSep *pSVar4;
  Transition *pTVar5;
  size_type sVar6;
  char *local_f10;
  StreamSep local_f08;
  int local_ebc;
  char *local_eb8;
  StreamSep local_eb0;
  StreamSep local_e68;
  int local_e1c;
  StreamSep local_e18;
  StreamSep local_dd0;
  int local_d84;
  StreamSep local_d80;
  StreamSep local_d38;
  char *local_cf0;
  StreamSep local_ce8;
  StreamSep local_ca0;
  StreamSep local_c58;
  StreamSep local_c10;
  StreamSep local_bc8;
  StreamSep local_b80;
  StreamSep local_b38;
  StreamSep local_af0;
  StreamSep local_aa8;
  StreamSep local_a60;
  StreamSep local_a18;
  StreamSep local_9d0;
  StreamSep local_988;
  StreamSep local_940;
  uint local_8f4;
  StreamSep local_8f0;
  StreamSep local_8a8;
  StreamSep local_860;
  int local_814;
  StreamSep local_810;
  StreamSep local_7c8;
  StreamSep local_780;
  StreamSep local_738;
  byte local_6ec;
  allocator local_6eb;
  byte local_6ea;
  byte local_6e9;
  string local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  StreamSep local_688;
  StreamSep local_640;
  StreamSep local_5f8;
  StreamSep local_5b0;
  uint local_564;
  StreamSep local_560;
  StreamSep local_518;
  StreamSep local_4d0;
  string local_488;
  allocator local_461;
  string local_460;
  allocator local_439;
  string local_438;
  int local_414;
  StreamSep local_410;
  StreamSep local_3c8;
  StreamSep local_380;
  StreamSep local_338;
  StreamSep local_2f0;
  int local_2a4;
  StreamSep local_2a0;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  StreamSep local_1e8;
  StreamSep local_1a0;
  StreamSep local_158;
  StreamSep local_110;
  StreamSep local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string v;
  uint cont_label;
  CppEmitter *cpp_emitter_local;
  StreamSepMaker *es_local;
  StreamSepMaker *ss_local;
  InstructionSkipBytes *this_local;
  
  bVar1 = CppEmitter::need_buf(cpp_emitter);
  if (bVar1) {
    v.field_2._12_4_ = cpp_emitter->nb_cont_label + 1;
    cpp_emitter->nb_cont_label = v.field_2._12_4_;
    std::__cxx11::string::string((string *)local_50,(string *)&this->var);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::CharGraph::Variable>_>_>
            ::count(&cpp_emitter->variables,(key_type *)local_50);
    if (sVar3 != 0) {
      std::operator+(&local_80,"HPIPE_DATA.",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    if ((this->beg & 1U) != 0) {
      StreamSepMaker::operator<<(&local_c8,ss,(char (*) [6])"if ( ");
      pSVar4 = StreamSep::operator<<
                         (&local_c8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
      StreamSep::operator<<(pSVar4,(char (*) [5])0x24952b);
      StreamSep::~StreamSep(&local_c8);
      std::__cxx11::string::operator+=((string *)&ss->beg,"    ");
      StreamSepMaker::operator<<(&local_110,ss,(char (*) [14])"size_t __l = ");
      pSVar4 = StreamSep::operator<<
                         (&local_110,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
      StreamSep::operator<<(pSVar4,(char (*) [6])0x24a445);
      StreamSep::~StreamSep(&local_110);
      std::__cxx11::string::operator=((string *)local_50,"__l");
    }
    StreamSepMaker::operator<<(&local_158,ss,(char (*) [13])"if ( data + ");
    pSVar4 = StreamSep::operator<<
                       (&local_158,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
    StreamSep::operator<<(pSVar4,(char (*) [15])" <= end_m1 ) {");
    StreamSep::~StreamSep(&local_158);
    StreamSepMaker::operator<<(&local_1a0,ss,(char (*) [13])"    data += ");
    pSVar4 = StreamSep::operator<<
                       (&local_1a0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
    StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_1a0);
    StreamSepMaker::operator<<(&local_1e8,ss,(char (*) [9])"} else {");
    StreamSep::~StreamSep(&local_1e8);
    Vec<std::__cxx11::string>::push_back_unique<char_const(&)[73]>
              ((Vec<std::__cxx11::string> *)&cpp_emitter->preliminaries,
               (char (*) [73])
               "#ifndef HPIPE_SIZE_T\n#define HPIPE_SIZE_T size_t\n#endif // HPIPE_SIZE_T\n");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208,"__bytes_to_skip",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"HPIPE_SIZE_T",&local_231);
    std::__cxx11::string::string((string *)&local_258);
    CppEmitter::add_variable(cpp_emitter,&local_208,&local_230,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    if (((this->beg & 1U) != 0) &&
       (sVar6 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                          (&(this->super_Instruction).next.
                            super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>),
       1 < sVar6)) {
      StreamSepMaker::operator<<(&local_2a0,es,(char (*) [21])"if ( ! buf ) goto l_");
      pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
      local_2a4 = Instruction::get_id_gen(pTVar5->inst,cpp_emitter);
      pSVar4 = StreamSep::operator<<(&local_2a0,&local_2a4);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_2a0);
    }
    StreamSepMaker::operator<<(&local_2f0,ss,(char (*) [34])"    HPIPE_DATA.__bytes_to_skip = ");
    pSVar4 = StreamSep::operator<<
                       (&local_2f0,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_50);
    StreamSep::operator<<(pSVar4,(char (*) [37])" - ( buf->data + buf->used - data );");
    StreamSep::~StreamSep(&local_2f0);
    StreamSepMaker::operator<<(&local_338,ss,(char (*) [5])"  t_");
    pSVar4 = StreamSep::operator<<(&local_338,(uint *)(v.field_2._M_local_buf + 0xc));
    StreamSep::operator<<(pSVar4,(char (*) [2])0x2497fc);
    StreamSep::~StreamSep(&local_338);
    StreamSepMaker::operator<<(&local_380,ss,(char (*) [25])"    if ( ! buf->next ) {");
    StreamSep::~StreamSep(&local_380);
    bVar1 = CppEmitter::interruptible(cpp_emitter);
    if (bVar1) {
      StreamSepMaker::operator<<(&local_3c8,ss,(char (*) [24])"        if ( last_buf )");
      StreamSep::~StreamSep(&local_3c8);
      StreamSepMaker::operator<<(&local_410,ss,(char (*) [20])"            goto l_");
      pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
      local_414 = Instruction::get_id_gen(pTVar5->inst,cpp_emitter);
      pSVar4 = StreamSep::operator<<(&local_410,&local_414);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_410);
      uVar2 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar2 == 0) {
        StreamSepMaker::operator<<
                  (&local_5f8,ss,(char (*) [35])"        HPIPE_DATA.inp_cont = &&c_");
        pSVar4 = StreamSep::operator<<(&local_5f8,(uint *)(v.field_2._M_local_buf + 0xc));
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_5f8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_438,"pending_buf",&local_439);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_460,"HPIPE_BUFF_T *",&local_461);
        std::__cxx11::string::string((string *)&local_488);
        CppEmitter::add_variable(cpp_emitter,&local_438,&local_460,&local_488);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_460);
        std::allocator<char>::~allocator((allocator<char> *)&local_461);
        std::__cxx11::string::~string((string *)&local_438);
        std::allocator<char>::~allocator((allocator<char> *)&local_439);
        StreamSepMaker::operator<<
                  (&local_4d0,ss,(char (*) [38])"        HPIPE_DATA.pending_buf = buf;");
        StreamSep::~StreamSep(&local_4d0);
        if (cpp_emitter->buffer_type == 1) {
          uVar2 = Instruction::need_buf_next(&this->super_Instruction);
          if (uVar2 == 1) {
            StreamSepMaker::operator<<
                      (&local_518,ss,(char (*) [38])"        HPIPE_BUFF_T__INC_REF( buf );");
            StreamSep::~StreamSep(&local_518);
          }
          else {
            StreamSepMaker::operator<<
                      (&local_560,ss,(char (*) [39])"        HPIPE_BUFF_T__INC_REF_N( buf, ");
            local_564 = Instruction::need_buf_next(&this->super_Instruction);
            pSVar4 = StreamSep::operator<<(&local_560,&local_564);
            StreamSep::operator<<(pSVar4,(char (*) [4])0x2496e6);
            StreamSep::~StreamSep(&local_560);
          }
        }
        StreamSepMaker::operator<<
                  (&local_5b0,ss,(char (*) [35])"        HPIPE_DATA.inp_cont = &&e_");
        pSVar4 = StreamSep::operator<<(&local_5b0,(uint *)(v.field_2._M_local_buf + 0xc));
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_5b0);
      }
      StreamSepMaker::operator<<(&local_640,ss,(char (*) [25])"        return RET_CONT;");
      StreamSep::~StreamSep(&local_640);
      uVar2 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar2 != 0) {
        StreamSepMaker::operator<<(&local_688,ss,(char (*) [9])"      e_");
        pSVar4 = StreamSep::operator<<(&local_688,(uint *)(v.field_2._M_local_buf + 0xc));
        pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [2])0x2497fc);
        local_6e9 = 0;
        local_6ea = 0;
        local_6ec = 0;
        if ((cpp_emitter->trace_labels & 1U) == 0) {
          std::allocator<char>::allocator();
          local_6ec = 1;
          std::__cxx11::string::string((string *)&local_6a8,"",&local_6eb);
        }
        else {
          to_string<unsigned_int>(&local_6e8,(uint *)(v.field_2._M_local_buf + 0xc));
          local_6e9 = 1;
          std::operator+(&local_6c8," std::cout << \"e_",&local_6e8);
          local_6ea = 1;
          std::operator+(&local_6a8,&local_6c8," \" << __LINE__ << std::endl;");
        }
        StreamSep::operator<<(pSVar4,&local_6a8);
        std::__cxx11::string::~string((string *)&local_6a8);
        if ((local_6ec & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_6eb);
        }
        if ((local_6ea & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_6c8);
        }
        if ((local_6e9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_6e8);
        }
        StreamSep::~StreamSep(&local_688);
        StreamSepMaker::operator<<
                  (&local_738,ss,(char (*) [44])"        HPIPE_DATA.pending_buf->next = buf;");
        StreamSep::~StreamSep(&local_738);
        StreamSepMaker::operator<<
                  (&local_780,ss,(char (*) [38])"        HPIPE_DATA.pending_buf = buf;");
        StreamSep::~StreamSep(&local_780);
        StreamSepMaker::operator<<(&local_7c8,ss,(char (*) [16])"        goto c_");
        pSVar4 = StreamSep::operator<<(&local_7c8,(uint *)(v.field_2._M_local_buf + 0xc));
        StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
        StreamSep::~StreamSep(&local_7c8);
      }
    }
    else {
      StreamSepMaker::operator<<(&local_810,ss,(char (*) [16])0x24a12c);
      pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
      local_814 = Instruction::get_id_gen(pTVar5->inst,cpp_emitter);
      pSVar4 = StreamSep::operator<<(&local_810,&local_814);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_810);
    }
    StreamSepMaker::operator<<(&local_860,ss,(char (*) [6])"    }");
    StreamSep::~StreamSep(&local_860);
    if (cpp_emitter->buffer_type == 0) {
      StreamSepMaker::operator<<
                (&local_8a8,ss,(char (*) [39])"    end -= buf->used; buf = buf->next;");
      StreamSep::~StreamSep(&local_8a8);
    }
    else {
      uVar2 = Instruction::need_buf_next(&this->super_Instruction);
      if (uVar2 < 2) {
        uVar2 = Instruction::need_buf_next(&this->super_Instruction);
        if (uVar2 == 1) {
          StreamSepMaker::operator<<(&local_940,ss,(char (*) [21])"    buf = buf->next;");
          StreamSep::~StreamSep(&local_940);
        }
        else {
          StreamSepMaker::operator<<
                    (&local_988,ss,
                     (char (*) [76])
                     "    HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old );");
          StreamSep::~StreamSep(&local_988);
        }
      }
      else {
        StreamSepMaker::operator<<(&local_8f0,ss,(char (*) [35])0x24a198);
        local_8f4 = Instruction::need_buf_next(&this->super_Instruction);
        local_8f4 = local_8f4 - 1;
        pSVar4 = StreamSep::operator<<(&local_8f0,&local_8f4);
        StreamSep::operator<<(pSVar4,(char (*) [21])" ); buf = buf->next;");
        StreamSep::~StreamSep(&local_8f0);
      }
    }
    StreamSepMaker::operator<<(&local_9d0,ss,(char (*) [5])"  c_");
    pSVar4 = StreamSep::operator<<(&local_9d0,(uint *)(v.field_2._M_local_buf + 0xc));
    StreamSep::operator<<(pSVar4,(char (*) [2])0x2497fc);
    StreamSep::~StreamSep(&local_9d0);
    StreamSepMaker::operator<<
              (&local_a18,ss,(char (*) [53])"    if ( HPIPE_DATA.__bytes_to_skip >= buf->used ) {");
    StreamSep::~StreamSep(&local_a18);
    StreamSepMaker::operator<<
              (&local_a60,ss,(char (*) [49])"        HPIPE_DATA.__bytes_to_skip -= buf->used;");
    StreamSep::~StreamSep(&local_a60);
    StreamSepMaker::operator<<(&local_aa8,ss,(char (*) [16])"        goto t_");
    pSVar4 = StreamSep::operator<<(&local_aa8,(uint *)(v.field_2._M_local_buf + 0xc));
    StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_aa8);
    StreamSepMaker::operator<<(&local_af0,ss,(char (*) [6])"    }");
    StreamSep::~StreamSep(&local_af0);
    StreamSepMaker::operator<<
              (&local_b38,ss,(char (*) [51])"    data = buf->data + HPIPE_DATA.__bytes_to_skip;");
    StreamSep::~StreamSep(&local_b38);
    bVar1 = CppEmitter::interruptible(cpp_emitter);
    if (bVar1) {
      StreamSepMaker::operator<<
                (&local_b80,ss,(char (*) [40])"    end_m1 = buf->data + buf->used - 1;");
      StreamSep::~StreamSep(&local_b80);
    }
    else {
      StreamSepMaker::operator<<
                (&local_bc8,ss,
                 (char (*) [68])
                 "    end_m1 = buf->data + ( end > buf->used ? buf->used : end ) - 1;");
      StreamSep::~StreamSep(&local_bc8);
    }
    StreamSepMaker::operator<<(&local_c10,ss,(char (*) [2])0x24a292);
    StreamSep::~StreamSep(&local_c10);
    if ((this->beg & 1U) != 0) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)&ss->beg);
      StreamSepMaker::operator<<(&local_c58,ss,(char (*) [2])0x24a292);
      StreamSep::~StreamSep(&local_c58);
    }
    std::__cxx11::string::~string((string *)local_50);
  }
  else if (cpp_emitter->buffer_type == 3) {
    if ((this->beg & 1U) != 0) {
      StreamSepMaker::operator<<(&local_ca0,ss,(char (*) [6])"if ( ");
      pSVar4 = StreamSep::operator<<(&local_ca0,&this->var);
      StreamSep::operator<<(pSVar4,(char (*) [5])0x24952b);
      StreamSep::~StreamSep(&local_ca0);
      std::__cxx11::string::operator+=((string *)&ss->beg,"    ");
    }
    StreamSepMaker::operator<<(&local_ce8,ss,(char (*) [19])"for( size_t n = ( ");
    pSVar4 = StreamSep::operator<<(&local_ce8,&this->var);
    local_cf0 = " )";
    if ((this->beg & 1U) != 0) {
      local_cf0 = " ) - 1";
    }
    pSVar4 = StreamSep::operator<<(pSVar4,&local_cf0);
    StreamSep::operator<<(pSVar4,(char (*) [16])"; n--; ++data )");
    StreamSep::~StreamSep(&local_ce8);
    StreamSepMaker::operator<<(&local_d38,ss,(char (*) [19])"    if ( *data == ");
    pSVar4 = StreamSep::operator<<(&local_d38,&cpp_emitter->stop_char);
    StreamSep::operator<<(pSVar4,(char (*) [3])0x24b6e9);
    StreamSep::~StreamSep(&local_d38);
    StreamSepMaker::operator<<(&local_d80,ss,(char (*) [16])0x24a12c);
    pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
    local_d84 = Instruction::get_id_gen(pTVar5->inst,cpp_emitter);
    pSVar4 = StreamSep::operator<<(&local_d80,&local_d84);
    StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_d80);
    StreamSepMaker::operator<<(&local_dd0,ss,(char (*) [15])0x24a479);
    pSVar4 = StreamSep::operator<<(&local_dd0,&cpp_emitter->stop_char);
    StreamSep::operator<<(pSVar4,(char (*) [3])0x24b6e9);
    StreamSep::~StreamSep(&local_dd0);
    StreamSepMaker::operator<<(&local_e18,ss,(char (*) [12])0x24a130);
    pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
    local_e1c = Instruction::get_id_gen(pTVar5->inst,cpp_emitter);
    pSVar4 = StreamSep::operator<<(&local_e18,&local_e1c);
    StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_e18);
    if ((this->beg & 1U) != 0) {
      std::__cxx11::string::size();
      std::__cxx11::string::resize((ulong)&ss->beg);
      StreamSepMaker::operator<<(&local_e68,ss,(char (*) [2])0x24a292);
      StreamSep::~StreamSep(&local_e68);
    }
  }
  else {
    sVar6 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                      (&(this->super_Instruction).next.
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    if (1 < sVar6) {
      StreamSepMaker::operator<<(&local_eb0,ss,(char (*) [15])"if ( data + ( ");
      pSVar4 = StreamSep::operator<<(&local_eb0,&this->var);
      local_eb8 = " )";
      if ((this->beg & 1U) != 0) {
        local_eb8 = " ) - 1";
      }
      pSVar4 = StreamSep::operator<<(pSVar4,&local_eb8);
      pSVar4 = StreamSep::operator<<(pSVar4,(char (*) [20])" > end_m1 ) goto l_");
      pTVar5 = Vec<Hpipe::Transition>::operator[](&(this->super_Instruction).next,1);
      local_ebc = Instruction::get_id_gen(pTVar5->inst,cpp_emitter);
      pSVar4 = StreamSep::operator<<(pSVar4,&local_ebc);
      StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
      StreamSep::~StreamSep(&local_eb0);
    }
    StreamSepMaker::operator<<(&local_f08,ss,(char (*) [11])"data += ( ");
    pSVar4 = StreamSep::operator<<(&local_f08,&this->var);
    local_f10 = " )";
    if ((this->beg & 1U) != 0) {
      local_f10 = " ) - 1";
    }
    pSVar4 = StreamSep::operator<<(pSVar4,&local_f10);
    StreamSep::operator<<(pSVar4,(char (*) [2])0x2496e8);
    StreamSep::~StreamSep(&local_f08);
  }
  Instruction::write_trans(&this->super_Instruction,ss,cpp_emitter,0);
  return;
}

Assistant:

void InstructionSkipBytes::write_cpp( StreamSepMaker &ss, StreamSepMaker &es, CppEmitter *cpp_emitter ) {
    if ( cpp_emitter->need_buf() ) {
        unsigned cont_label = ++cpp_emitter->nb_cont_label;

        // cpp_emitter->need_loc_var(  );
        std::string v = var;
        if ( cpp_emitter->variables.count( v ) )
            v = "HPIPE_DATA." + v;
        if ( beg ) {
            ss << "if ( " << v << " ) {";
            ss.beg += "    ";
            ss << "size_t __l = " << v << " - 1;";
            v = "__l";
        }
        // we can stay in the same buffer
        ss << "if ( data + " << v << " <= end_m1 ) {";
        ss << "    data += " << v << ";";
        ss << "} else {";
        // skip data in current buf
        cpp_emitter->preliminaries.push_back_unique( "#ifndef HPIPE_SIZE_T\n#define HPIPE_SIZE_T size_t\n#endif // HPIPE_SIZE_T\n" );
        cpp_emitter->add_variable( "__bytes_to_skip", "HPIPE_SIZE_T" );
        if ( beg && next.size() >= 2 )
            es << "if ( ! buf ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "    HPIPE_DATA.__bytes_to_skip = " << v << " - ( buf->data + buf->used - data );";
        ss << "  t_" << cont_label << ":";
        ss << "    if ( ! buf->next ) {";
        if ( cpp_emitter->interruptible() ) {
            ss << "        if ( last_buf )";
            ss << "            goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
            if ( need_buf_next() ) {
                cpp_emitter->add_variable( "pending_buf", "HPIPE_BUFF_T *" );
                ss << "        HPIPE_DATA.pending_buf = buf;";
                if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_BUFFER ) {
                    if ( need_buf_next() == 1 )
                        ss << "        HPIPE_BUFF_T__INC_REF( buf );";
                    else
                        ss << "        HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() << " );";
                }
                ss << "        HPIPE_DATA.inp_cont = &&e_" << cont_label << ";";
            } else
                ss << "        HPIPE_DATA.inp_cont = &&c_" << cont_label << ";";
            ss << "        return RET_CONT;";
            if ( need_buf_next() ) {
                // e_... (come back code)
                ss << "      e_" << cont_label << ":" << ( cpp_emitter->trace_labels ? " std::cout << \"e_" + to_string( cont_label ) + " \" << __LINE__ << std::endl;" : "" );
                ss << "        HPIPE_DATA.pending_buf->next = buf;";
                ss << "        HPIPE_DATA.pending_buf = buf;";
                ss << "        goto c_" << cont_label << ";";
            }
        } else
            ss << "        goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "    }";
        if ( cpp_emitter->buffer_type == CppEmitter::BT_HPIPE_CB_STRING_PTR )
            ss << "    end -= buf->used; buf = buf->next;";
        else if ( need_buf_next() > 1 )
            ss << "    HPIPE_BUFF_T__INC_REF_N( buf, " << need_buf_next() - 1 << " ); buf = buf->next;";
        else if ( need_buf_next() == 1 )
            ss << "    buf = buf->next;";
        else
            ss << "    HPIPE_BUFF_T *old = buf; buf = buf->next; HPIPE_BUFF_T__DEC_REF( old );";
        ss << "  c_" << cont_label << ":";
        ss << "    if ( HPIPE_DATA.__bytes_to_skip >= buf->used ) {";
        ss << "        HPIPE_DATA.__bytes_to_skip -= buf->used;";
        ss << "        goto t_" << cont_label << ";";
        ss << "    }";
        ss << "    data = buf->data + HPIPE_DATA.__bytes_to_skip;";
        if ( cpp_emitter->interruptible() )
            ss << "    end_m1 = buf->data + buf->used - 1;";
        else
            ss << "    end_m1 = buf->data + ( end > buf->used ? buf->used : end ) - 1;";
        ss << "}";
        if ( beg ) {
            ss.beg.resize( ss.beg.size() - 4 );
            ss << "}";
        }
    } else if ( cpp_emitter->buffer_type == CppEmitter::BT_C_STR ) {
        if ( beg ) {
            ss << "if ( " << var << " ) {";
            ss.beg += "    ";
        }
        ss << "for( size_t n = ( " << var << ( beg ? " ) - 1" : " )" ) << "; n--; ++data )";
        ss << "    if ( *data == " << cpp_emitter->stop_char << " )";
        ss << "        goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "if ( *data == " << cpp_emitter->stop_char << " )";
        ss << "    goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        if ( beg ) {
            ss.beg.resize( ss.beg.size() - 4 );
            ss << "}";
        }
    } else {
        if ( next.size() > 1 )
            ss << "if ( data + ( " << var << ( beg ? " ) - 1" : " )" ) << " > end_m1 ) goto l_" << next[ 1 ].inst->get_id_gen( cpp_emitter ) << ";";
        ss << "data += ( " << var << ( beg ? " ) - 1" : " )" ) << ";";
    }
    write_trans( ss, cpp_emitter );
}